

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.cpp
# Opt level: O3

double despot::Gamma::Next(double k,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_48;
  double local_30;
  double local_28;
  
  if (1.0 <= k) {
    dVar4 = k + k + -1.0;
    local_30 = SQRT(dVar4);
    dVar1 = local_30;
    if (dVar4 < 0.0) {
      dVar1 = sqrt(dVar4);
      local_30 = sqrt(dVar4);
    }
    do {
      dVar4 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar3 = log(dVar2 / (1.0 - dVar2));
      local_48 = exp(dVar3 / local_30);
      local_48 = local_48 * k;
      dVar2 = dVar4 * dVar2 * dVar2;
      dVar4 = ((dVar3 / local_30) * (dVar1 + k) + k + -1.3862943611198906) - local_48;
      if (dVar2 * 4.5 + -2.504077396776274 <= dVar4) break;
      dVar2 = log(dVar2);
    } while (dVar4 < dVar2);
  }
  else {
    dVar1 = pow(k,k / (1.0 - k));
    do {
      dVar4 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar4 = log(dVar4);
      local_28 = -dVar4;
      local_48 = log(dVar2);
      local_48 = -local_48;
      dVar2 = pow(local_28,1.0 / k);
      dVar4 = local_48 - dVar4;
      local_48 = dVar2;
    } while (dVar4 < dVar1 * (1.0 - k) + dVar2);
  }
  return local_48 * theta;
}

Assistant:

double Gamma::Next(double k, double theta) {
	if (k < 1) {
		double c = 1 / k;
		double d = (1 - k) * pow(k, k / (1 - k));
		double z, e, x;
		while (true) { //Weibull's algorithm
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			z = -log(u);
			e = -log(v);
			x = pow(z, c);
			if (z + e >= d + x)
				return x * theta;
		}
	} else { // Cheng's algorithm
		double b = k - log(4);
		double c = k + sqrt(2 * k - 1);
		double d = sqrt(2 * k - 1);
		double e = 1 + log(4.5);
		double x, y, z, r;
		while (true) {
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			y = log(v / (1 - v)) / d;
			x = k * exp(y);
			z = u * v * v;
			r = b + c * y - x;
			if (r >= 4.5 * z - e || r >= log(z))
				return x * theta;
		}
	}
}